

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pak.cpp
# Opt level: O0

FResourceFile * CheckPak(char *filename,FileReader *file,bool quiet)

{
  uint uVar1;
  long lVar2;
  FResourceFile *this;
  FResourceFile *rf;
  char head [4];
  FileReader *pFStack_20;
  bool quiet_local;
  FileReader *file_local;
  char *filename_local;
  
  rf._7_1_ = quiet;
  pFStack_20 = file;
  lVar2 = FileReader::GetLength(file);
  if (0xb < lVar2) {
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_20,0,0);
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_20,(long)&rf + 3,4);
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_20,0,0);
    if (rf._3_4_ == 0x4b434150) {
      this = (FResourceFile *)operator_new(0x28);
      FPakFile::FPakFile((FPakFile *)this,filename,pFStack_20);
      uVar1 = (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
                _vptr_FResourceFile[3])(this,(ulong)rf._7_1_ & 1);
      if ((uVar1 & 1) != 0) {
        return this;
      }
      *(FileReader **)&((FUncompressedFile *)&this->Reader)->super_FResourceFile = (FileReader *)0x0
      ;
      if (this != (FResourceFile *)0x0) {
        (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
          _vptr_FResourceFile[1])();
      }
    }
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckPak(const char *filename, FileReader *file, bool quiet)
{
	char head[4];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 4);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "PACK", 4))
		{
			FResourceFile *rf = new FPakFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}